

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

void handle_splicing(token *word)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  
  sVar3 = word->data_size;
  if (sVar3 != 0) {
    for (lVar4 = 0; sVar3 - 1 != lVar4; lVar4 = lVar4 + 1) {
      if ((word->data[lVar4] == '\\') && (word->data[lVar4 + 1] == '\n')) {
        if (sVar3 - 3 == lVar4) {
          return;
        }
        lVar5 = lVar4 + 2;
        do {
          pcVar2 = word->data;
          lVar5 = lVar5 + 1;
          while( true ) {
            cVar1 = pcVar2[lVar5 + -1];
            if (sVar3 - 1 <= lVar5 - 1U) {
              pcVar2[lVar4] = cVar1;
              return;
            }
            if ((cVar1 != '\\') || (pcVar2[lVar5] != '\n')) break;
            lVar5 = lVar5 + 2;
          }
          pcVar2[lVar4] = cVar1;
          lVar4 = lVar4 + 1;
          sVar3 = word->data_size;
        } while( true );
      }
    }
  }
  return;
}

Assistant:

void handle_splicing(struct token *word)
{
	size_t back;
	size_t front;
	if(word->data_size==0)
		return;
	front=0;
	for(front;front<word->data_size-1;++front)
	{
		if(word->data[front]=='\\' && word->data[front+1]=='\n')
		{
			front+=2;
			break;
		}
	}
	if(front==word->data_size-1)
		return;

	for(back=front-2;front<word->data_size-1;)
	{
		if(word->data[front]=='\\' && word->data[front+1]=='\n')
		{
			front+=2;
		}else
		{
			word->data[back]=word->data[front];
			++front;
			++back;
		}
	}
	word->data[back]=word->data[front];
}